

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

Node parse_subexpr(Parser *psr,Precedence minimum)

{
  BcIns *pBVar1;
  uint64_t uVar2;
  Node *node;
  undefined4 uVar3;
  _Bool _Var4;
  byte bVar5;
  byte bVar6;
  undefined1 uVar7;
  NodeType NVar8;
  BcOp BVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  Node *node_00;
  Lexer *pLVar14;
  Precedence minimum_00;
  undefined4 left_00;
  bool bVar15;
  anon_union_8_6_f630ca3c_for_Node_1 aVar16;
  Node NVar17;
  Node right;
  Node left;
  Node local_68;
  undefined1 local_58 [28];
  Precedence local_3c;
  Lexer *local_38;
  
  iVar10 = (psr->lxr).tk.type;
  local_3c = minimum;
  switch(iVar10) {
  case 0x113:
    NVar8 = NODE_RELOC;
    lex_next(&psr->lxr);
    iVar10 = parse_fn_args_body(psr);
    uVar11 = fn_emit(psr->vm->fns + psr->scope->fn,iVar10 * 0x10000 + 3);
    aVar16.jmp.false_list = 0;
    aVar16.reloc_idx = uVar11;
    local_58._8_8_ = aVar16;
    break;
  case 0x114:
    NVar8 = NODE_LOCAL;
    uVar2 = (psr->lxr).tk.field_4.ident_hash;
    lex_next(&psr->lxr);
    lVar12 = (long)psr->scope->first_local;
    iVar10 = 0;
    do {
      if (psr->locals_count <= lVar12) {
LAB_00158294:
        psr_trigger_err(psr,"variable not defined");
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                      ,0x4a2,"Node expr_operand_name(Parser *)");
      }
      if (psr->locals[lVar12].name == uVar2) {
        if (iVar10 != 1) {
          aVar16.prim = -iVar10 & 0xff;
          aVar16.jmp.false_list = 0;
          local_58._8_8_ = aVar16;
          break;
        }
        goto LAB_00158294;
      }
      lVar12 = lVar12 + 1;
      iVar10 = iVar10 + -1;
    } while( true );
  case 0x115:
    aVar16 = *(anon_union_8_6_f630ca3c_for_Node_1 *)&(psr->lxr).tk.field_4;
    lex_next(&psr->lxr);
    NVar8 = NODE_NUM;
    local_58._8_8_ = aVar16;
    break;
  case 0x116:
  case 0x117:
  case 0x118:
    NVar8 = NODE_PRIM;
    aVar16.prim = iVar10 - 0x116;
    aVar16.jmp.false_list = 0;
LAB_00157aed:
    lex_next(&psr->lxr);
    local_58._8_8_ = aVar16;
    break;
  default:
    if (iVar10 != 0x2d) {
      if (iVar10 == 0x28) {
        lex_next(&psr->lxr);
        NVar17 = parse_subexpr(psr,PREC_NONE);
        aVar16 = NVar17.field_1;
        NVar8 = NVar17.type;
        lex_expect(&psr->lxr,0x29);
        goto LAB_00157aed;
      }
      if (iVar10 != 0x21) {
        psr_trigger_err(psr,"expected expression");
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                      ,0x4de,"Node expr_operand(Parser *)");
      }
    }
    lex_next(&psr->lxr);
    NVar17 = parse_subexpr(psr,PREC_UNARY);
    local_58._8_8_ = NVar17.field_1;
    local_58._0_4_ = NVar17.type;
    if (iVar10 == 0x21) {
      expr_to_jmp(psr,(Node *)local_58);
      uVar3 = local_58._12_4_;
      aVar16.jmp.false_list = 0;
      aVar16.prim = local_58._12_4_;
      local_58._12_4_ = local_58._8_4_;
      local_58._8_4_ = uVar3;
      NVar8 = local_58._0_4_;
    }
    else {
      if (iVar10 != 0x2d) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                      ,0x432,"void expr_emit_unary(Parser *, Tk, Node *)");
      }
      if (local_58._0_4_ == NODE_NUM) {
        aVar16 = (anon_union_8_6_f630ca3c_for_Node_1)(local_58._8_8_ ^ (ulong)DAT_00175be0);
        NVar8 = NODE_NUM;
        local_58._8_8_ = aVar16;
      }
      else {
        if (local_58._0_4_ == NODE_PRIM) {
          psr_trigger_err(psr,"invalid operand to unary operator");
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                        ,0x40e,"void expr_emit_neg(Parser *, Node *)");
        }
        expr_discharge(psr,(Node *)local_58);
        if (local_58._0_4_ == NODE_NON_RELOC) {
          uVar7 = local_58[8];
        }
        else {
          uVar7 = expr_to_next_slot(psr,(Node *)local_58);
        }
        expr_free_node(psr,(Node *)local_58);
        uVar11 = fn_emit(psr->vm->fns + psr->scope->fn,(uint)(byte)uVar7 << 0x10 | 0xe);
        aVar16.jmp.false_list = 0;
        aVar16.reloc_idx = uVar11;
        local_58._8_4_ = uVar11;
        NVar8 = NODE_RELOC;
      }
    }
  }
  if ((psr->lxr).tk.type == 0x28) {
    if (NVar8 != NODE_LOCAL) {
      psr_trigger_err(psr,"cannot call non-local type");
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                    ,0x43b,"void expr_postfix_fn_call(Parser *, Node *)");
    }
    pLVar14 = &psr->lxr;
    lex_next(pLVar14);
    uVar11 = psr->scope->next_slot;
    while ((psr->lxr).tk.type != 0x29) {
      NVar17 = parse_subexpr(psr,PREC_NONE);
      local_68.field_1 = NVar17.field_1;
      local_68.type = NVar17.type;
      expr_to_next_slot(psr,&local_68);
      if ((psr->lxr).tk.type == 0x2c) {
        lex_next(pLVar14);
      }
    }
    lex_next(pLVar14);
    fn_emit(psr->vm->fns + psr->scope->fn,
            (psr->scope->next_slot - uVar11) * 0x1000000 +
            ((uVar11 & 0xff) << 0x10 | (aVar16.prim & 0xff) << 8) + 0x1f);
    local_58[8] = (char)uVar11;
    psr->scope->next_slot = (uVar11 & 0xff) + 1;
    NVar8 = NODE_NON_RELOC;
  }
  left.field_1 = (anon_union_8_6_f630ca3c_for_Node_1)local_58._8_8_;
  pLVar14 = &psr->lxr;
  left.type = NVar8;
  local_38 = pLVar14;
  do {
    uVar11 = (psr->lxr).tk.type;
    minimum_00 = PREC_OR;
    switch(uVar11) {
    case 0x100:
      minimum_00 = PREC_CONCAT;
      break;
    case 0x101:
    case 0x102:
    case 0x103:
    case 0x104:
    case 0x105:
switchD_00157bf1_caseD_101:
      NVar17._4_4_ = 0;
      NVar17.type = left.type;
      NVar17.field_1 = left.field_1;
      return NVar17;
    case 0x106:
    case 0x107:
      minimum_00 = PREC_EQ;
      break;
    case 0x108:
    case 0x109:
switchD_00157bf1_caseD_108:
      minimum_00 = PREC_ORD;
      break;
    case 0x10a:
      minimum_00 = PREC_AND;
      break;
    case 0x10b:
      break;
    default:
      switch(uVar11) {
      case 0x2a:
      case 0x2f:
        minimum_00 = PREC_MUL;
        break;
      case 0x2b:
      case 0x2d:
        minimum_00 = PREC_ADD;
        break;
      case 0x2c:
      case 0x2e:
        goto switchD_00157bf1_caseD_101;
      default:
        if ((uVar11 == 0x3c) || (uVar11 == 0x3e)) goto switchD_00157bf1_caseD_108;
        goto switchD_00157bf1_caseD_101;
      }
    }
    if (minimum_00 <= local_3c) goto switchD_00157bf1_caseD_101;
    lex_next(pLVar14);
    uVar13 = (ulong)uVar11;
    if (uVar11 < 0x3f) {
      if ((0xac0000000000U >> (uVar13 & 0x3f) & 1) == 0) {
        if ((0x5000000000000000U >> (uVar13 & 0x3f) & 1) == 0) goto LAB_00157c81;
        goto LAB_00157c91;
      }
      if (left.type == NODE_NUM) goto LAB_00157cac;
      if (left.type == NODE_PRIM) {
        psr_trigger_err(psr,"invalid operand to binary operator");
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                      ,0x3ef,"void expr_emit_binary_left(Parser *, Tk, Node *)");
      }
LAB_00157ca1:
      expr_to_ins_arg(psr,&left);
    }
    else {
LAB_00157c81:
      if (uVar11 - 0x106 < 4) {
LAB_00157c91:
        if (left.type != NODE_NUM) {
          if (left.type == NODE_PRIM) {
            psr_trigger_err(psr,"invalid operand to binary operator");
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                          ,0x3f9,"void expr_emit_binary_left(Parser *, Tk, Node *)");
          }
          goto LAB_00157ca1;
        }
      }
      else {
        if ((uVar11 & 0xfffffffe) != 0x10a) goto LAB_00157ca1;
        expr_to_jmp(psr,&left);
      }
    }
LAB_00157cac:
    NVar17 = parse_subexpr(psr,minimum_00);
    aVar16 = NVar17.field_1;
    NVar8 = NVar17.type;
    if (uVar11 < 0x3f) {
      if ((0xac0000000000U >> (uVar13 & 0x3f) & 1) == 0) {
        if ((0x5000000000000000U >> (uVar13 & 0x3f) & 1) == 0) goto code_r0x00157cd3;
        goto switchD_00157ce1_caseD_108;
      }
      right._4_4_ = 0;
      right.type = NVar8;
      right.field_1.num = aVar16.num;
      expr_emit_arith(psr,uVar11,&left,right);
    }
    else {
code_r0x00157cd3:
      switch(uVar11) {
      case 0x108:
      case 0x109:
switchD_00157ce1_caseD_108:
        if (NVar8 == NODE_PRIM) {
          psr_trigger_err(psr,"invalid operand to binary operator");
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                        ,0x35d,"void expr_emit_rel(Parser *, Tk, Node *, Node)");
        }
      case 0x106:
      case 0x107:
        if (left.type == NVar8) {
          if (NVar8 == NODE_PRIM) {
            if (uVar11 == 0x107) {
              bVar15 = left.field_1.prim != NVar17.field_1._0_4_;
            }
            else {
              if (uVar11 != 0x106) {
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                              ,0x34b,"_Bool expr_fold_rel(Tk, Node *, Node)");
              }
              bVar15 = left.field_1.prim == NVar17.field_1._0_4_;
            }
            goto LAB_001580b2;
          }
          if (NVar8 != NODE_NUM) goto LAB_00157dc9;
          switch(uVar11) {
          case 0x106:
            bVar15 = aVar16.num == left.field_1.num;
            break;
          case 0x107:
            bVar15 = aVar16.num != left.field_1.num;
            break;
          case 0x108:
            bVar15 = aVar16.num < left.field_1.num;
            goto LAB_0015809e;
          case 0x109:
            bVar15 = left.field_1.num < aVar16.num;
LAB_0015809e:
            bVar15 = !bVar15;
            goto LAB_001580b2;
          default:
            if (uVar11 == 0x3c) {
              bVar15 = aVar16.num < left.field_1.num;
            }
            else {
              if (uVar11 != 0x3e) {
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                              ,0x33e,"_Bool expr_fold_rel(Tk, Node *, Node)");
              }
              bVar15 = left.field_1.num < aVar16.num;
            }
            bVar15 = !bVar15 && left.field_1.num != aVar16.num;
            goto LAB_001580b2;
          }
          bVar15 = (bool)(-bVar15 & 1);
LAB_001580b2:
          left.type = NODE_PRIM;
          left.field_1 = (anon_union_8_6_f630ca3c_for_Node_1)
                         (CONCAT44(left.field_1.jmp.false_list,(uint)bVar15) | 2);
        }
        else {
LAB_00157dc9:
          if ((left.type < NODE_RELOC) && (left.type != NODE_LOCAL)) {
            _Var4 = binop_is_commutative(uVar11);
            if (!_Var4) {
              switch(uVar11) {
              case 0x106:
                uVar11 = 0x107;
                break;
              case 0x107:
                uVar11 = 0x106;
                break;
              case 0x108:
                uVar11 = 0x3e;
                break;
              case 0x109:
                uVar11 = 0x3c;
                break;
              default:
                if (uVar11 == 0x3c) {
                  uVar11 = 0x109;
                }
                else {
                  if (uVar11 != 0x3e) {
                    __assert_fail("false",
                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                                  ,0x14c,"Tk binop_invert_rel(Tk)");
                  }
                  uVar11 = 0x108;
                }
              }
            }
            local_68.type = NVar8;
            local_58._4_4_ = left._4_4_;
            local_58._0_4_ = left.type;
            local_58._8_8_ = left.field_1;
            local_68.field_1 = aVar16;
          }
          else {
            local_68._4_4_ = left._4_4_;
            local_68.type = left.type;
            local_68.field_1 = left.field_1;
            local_58._0_4_ = NVar8;
            local_58._8_8_ = aVar16;
          }
          bVar5 = expr_to_ins_arg(psr,&local_68);
          bVar6 = expr_to_ins_arg(psr,(Node *)local_58);
          node_00 = &local_68;
          node = (Node *)local_58;
          if (bVar6 < bVar5) {
            node_00 = (Node *)local_58;
            node = &local_68;
          }
          expr_free_node(psr,node);
          expr_free_node(psr,node_00);
          pLVar14 = local_38;
          if (local_58._0_4_ == NODE_PRIM) {
            iVar10 = 2;
          }
          else {
            iVar10 = 0;
            if (local_58._0_4_ != NODE_NON_RELOC) {
              if (local_58._0_4_ != NODE_CONST) {
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                              ,0x388,"void expr_emit_rel(Parser *, Tk, Node *, Node)");
              }
              iVar10 = 1;
            }
          }
          BVar9 = binop_opcode(uVar11);
          fn_emit(psr->vm->fns + psr->scope->fn,
                  (uint)bVar6 << 0x10 | (uint)bVar5 << 8 | iVar10 + BVar9);
          iVar10 = fn_emit(psr->vm->fns + psr->scope->fn,0x1d);
          jmp_set_target(psr,iVar10,-1);
          left.type = NODE_JMP;
          left.field_1.jmp.false_list = 0xffffffff;
          left.field_1.reloc_idx = iVar10;
        }
        break;
      case 0x10a:
        local_68.type = NVar8;
        local_68.field_1 = aVar16;
        expr_to_jmp(psr,&local_68);
        jmp_ensure_true_falls_through(psr,&left);
        uVar3 = left.field_1.jmp.false_list;
        jmp_list_patch(psr,left.field_1.reloc_idx,left.field_1.jmp.false_list + 1);
        left.field_1.prim = local_68.field_1.prim;
        iVar10 = jmp_list_merge(psr,uVar3,local_68.field_1.jmp.false_list);
        left.field_1.jmp.false_list = iVar10;
        break;
      case 0x10b:
        local_68.type = NVar8;
        local_68.field_1 = aVar16;
        expr_to_jmp(psr,&local_68);
        uVar3 = left.field_1.jmp.false_list;
        left_00 = left.field_1.prim;
        if (left.field_1.reloc_idx < left.field_1.jmp.false_list) {
          lVar12 = (long)left.field_1.jmp.false_list;
          pBVar1 = psr->vm->fns[psr->scope->fn].ins;
          BVar9 = relop_invert((uint)(byte)pBVar1[lVar12 + -1]);
          pBVar1[lVar12 + -1] = pBVar1[lVar12 + -1] & 0xffffff00 | BVar9;
          iVar10 = jmp_follow(psr,uVar3);
          left.field_1.jmp.false_list = iVar10;
          jmp_list_append(psr,&left.field_1.reloc_idx,uVar3);
          left_00 = left.field_1.prim;
        }
        jmp_list_patch(psr,left.field_1.jmp.false_list,left_00 + 1);
        left.field_1.jmp.false_list = local_68.field_1.jmp.false_list;
        iVar10 = jmp_list_merge(psr,left_00,local_68.field_1.reloc_idx);
        left.field_1.reloc_idx = iVar10;
        break;
      default:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                      ,0x3de,"void expr_emit_binary(Parser *, Tk, Node *, Node)");
      }
    }
  } while( true );
}

Assistant:

static Node parse_subexpr(Parser *psr, Precedence minimum) {
	// Parse the left operand to the binary operation
	Node left = expr_unary(psr);

	// Keep parsing binary operators until we encounter one with a precedence
	// less than the minimum
	// We need the explicit cast to an int, or else it tries to convert -1
	// returned by `binop_prec` into an unsigned value
	while (binop_prec(psr->lxr.tk.type) > minimum) {
		// Skip the binary operator token
		Tk binop = psr->lxr.tk.type;
		lex_next(&psr->lxr);

		// Some binary operations require us to emit code for the left operand
		// BEFORE we parse the right one
		expr_emit_binary_left(psr, binop, &left);

		// Parse the right operand to the binary operator
		Node right = parse_subexpr(psr, binop_prec(binop));

		// Emit bytecode for the whole binary operation
		expr_emit_binary(psr, binop, &left, right);
	}
	return left;
}